

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O1

int get_opaque_attr(attr_list l,atom_t attr_id,int *length_p,char **valp)

{
  int iVar1;
  int iVar2;
  attr_value_type t;
  attr_union v;
  attr_value_type local_24;
  anon_union_16_6_0081cd67_for_u local_20;
  
  iVar1 = query_pattr(l,attr_id,&local_24,(attr_union *)&local_20.o);
  iVar2 = 0;
  if ((iVar1 != 0) && (local_24 == Attr_Opaque)) {
    *length_p = (int)local_20.f;
    *valp = (char *)local_20.o.buffer;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
get_opaque_attr(attr_list l, atom_t attr_id, int *length_p, char **valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_Opaque:
        *length_p = v.u.o.length;
	*valp = v.u.o.buffer;
	break;
    default:
	return 0;
    }
    return 1;
}